

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O3

void HUD_InitHud(void)

{
  bool bVar1;
  int lumpnum;
  FTextureID FVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  char *pcVar5;
  int lastlump;
  FScanner sc;
  int local_138;
  FName local_134;
  FScanner local_130;
  
  if (gameinfo.gametype == GAME_Heretic) {
LAB_0062b3a9:
    healthpic = FTextureManager::FindTexture(&TexMan,"ARTIPTN2",8,1);
    pcVar5 = "HUDFONT_RAVEN";
  }
  else {
    if (gameinfo.gametype == GAME_Strife) {
      healthpic = FTextureManager::FindTexture(&TexMan,"I_MDKT",8,1);
      HudFont = BigFont;
      goto LAB_0062b459;
    }
    if (gameinfo.gametype == GAME_Hexen) goto LAB_0062b3a9;
    healthpic = FTextureManager::FindTexture(&TexMan,"MEDIA0",8,1);
    berserkpic = FTextureManager::FindTexture(&TexMan,"PSTRA0",8,1);
    pcVar5 = "HUDFONT_DOOM";
  }
  HudFont = FFont::FindFont(pcVar5);
LAB_0062b459:
  IndexFont = V_GetFont("INDEXFONT");
  if (HudFont == (FFont *)0x0) {
    HudFont = BigFont;
  }
  if (IndexFont == (FFont *)0x0) {
    IndexFont = ConFont;
  }
  invgems[0] = FTextureManager::FindTexture(&TexMan,"INVGEML1",8,1);
  invgems[1] = FTextureManager::FindTexture(&TexMan,"INVGEML2",8,1);
  invgems[2] = FTextureManager::FindTexture(&TexMan,"INVGEMR1",8,1);
  invgems[3] = FTextureManager::FindTexture(&TexMan,"INVGEMR2",8,1);
  fragpic = FTextureManager::FindTexture(&TexMan,"HU_FRAGS",8,1);
  if (KeyTypes.Count != 0) {
    KeyTypes.Count = 0;
  }
  if (UnassignedKeyTypes.Count != 0) {
    UnassignedKeyTypes.Count = 0;
  }
  statspace = FFont::StringWidth(SmallFont,(BYTE *)"Ac:");
  local_138 = 0;
  lumpnum = FWadCollection::FindLump(&Wads,"ALTHUDCF",&local_138,false);
  if (lumpnum != -1) {
    do {
      FScanner::FScanner(&local_130,lumpnum);
      while (bVar1 = FScanner::GetString(&local_130), bVar1) {
        bVar1 = FScanner::Compare(&local_130,"Health");
        if (bVar1) {
          FScanner::MustGetString(&local_130);
          FVar2 = FTextureManager::CheckForTexture(&TexMan,local_130.String,8,1);
          if (0 < FVar2.texnum) {
            if ((uint)FVar2.texnum < TexMan.Textures.Count) {
              healthpic = TexMan.Textures.Array[(uint)FVar2.texnum].Texture;
            }
            else {
              healthpic = (FTexture *)0x0;
            }
          }
        }
        else {
          bVar1 = FScanner::Compare(&local_130,"Berserk");
          if (bVar1) {
            FScanner::MustGetString(&local_130);
            FVar2 = FTextureManager::CheckForTexture(&TexMan,local_130.String,8,1);
            if (0 < FVar2.texnum) {
              if ((uint)FVar2.texnum < TexMan.Textures.Count) {
                berserkpic = TexMan.Textures.Array[(uint)FVar2.texnum].Texture;
              }
              else {
                berserkpic = (FTexture *)0x0;
              }
            }
          }
          else {
            local_134.Index = FName::NameManager::FindName(&FName::NameData,local_130.String,true);
            pPVar3 = PClass::FindClass(&local_134);
            pcVar5 = "Unknown item class \'%s\' in ALTHUDCF\n";
            if (pPVar3 == (PClass *)0x0) {
LAB_0062b6e1:
              Printf(pcVar5,local_130.String);
              pPVar3 = (PClass *)0x0;
            }
            else {
              pPVar4 = pPVar3;
              if (pPVar3 != AInventory::RegistrationInfo.MyClass) {
                do {
                  pPVar4 = pPVar4->ParentClass;
                  if (pPVar4 == AInventory::RegistrationInfo.MyClass) break;
                } while (pPVar4 != (PClass *)0x0);
                pcVar5 = "Invalid item class \'%s\' in ALTHUDCF\n";
                if (pPVar4 == (PClass *)0x0) goto LAB_0062b6e1;
              }
            }
            FScanner::MustGetString(&local_130);
            bVar1 = FScanner::Compare(&local_130,"0");
            FVar2.texnum = -1;
            if (((!bVar1) && (bVar1 = FScanner::Compare(&local_130,"NULL"), !bVar1)) &&
               (bVar1 = FScanner::Compare(&local_130,(char *)""), !bVar1)) {
              FVar2 = FTextureManager::CheckForTexture(&TexMan,local_130.String,8,1);
            }
            if (pPVar3 != (PClass *)0x0) {
              *(int *)((long)&pPVar3[2].super_PStruct.super_PNamedType.super_PCompoundType.
                              super_PType.super_DObject.Class + 4) = FVar2.texnum;
            }
          }
        }
      }
      FScanner::~FScanner(&local_130);
      lumpnum = FWadCollection::FindLump(&Wads,"ALTHUDCF",&local_138,false);
    } while (lumpnum != -1);
  }
  return;
}

Assistant:

void HUD_InitHud()
{
	switch (gameinfo.gametype)
	{
	case GAME_Heretic:
	case GAME_Hexen:
		healthpic = TexMan.FindTexture("ARTIPTN2");
		HudFont=FFont::FindFont("HUDFONT_RAVEN");
		break;

	case GAME_Strife:
		healthpic = TexMan.FindTexture("I_MDKT");
		HudFont=BigFont;	// Strife doesn't have anything nice so use the standard font
		break;

	default:
		healthpic = TexMan.FindTexture("MEDIA0");
		berserkpic = TexMan.FindTexture("PSTRA0");
		HudFont=FFont::FindFont("HUDFONT_DOOM");
		break;
	}

	IndexFont = V_GetFont("INDEXFONT");

	if (HudFont == NULL) HudFont = BigFont;
	if (IndexFont == NULL) IndexFont = ConFont;	// Emergency fallback

	invgems[0] = TexMan.FindTexture("INVGEML1");
	invgems[1] = TexMan.FindTexture("INVGEML2");
	invgems[2] = TexMan.FindTexture("INVGEMR1");
	invgems[3] = TexMan.FindTexture("INVGEMR2");

	fragpic = TexMan.FindTexture("HU_FRAGS");	// Sadly, I don't have anything usable for this. :(

	KeyTypes.Clear();
	UnassignedKeyTypes.Clear();

	statspace = SmallFont->StringWidth("Ac:");



	// Now read custom icon overrides
	int lump, lastlump = 0;

	while ((lump = Wads.FindLump ("ALTHUDCF", &lastlump)) != -1)
	{
		FScanner sc(lump);
		while (sc.GetString())
		{
			if (sc.Compare("Health"))
			{
				sc.MustGetString();
				FTextureID tex = TexMan.CheckForTexture(sc.String, FTexture::TEX_MiscPatch);
				if (tex.isValid()) healthpic = TexMan[tex];
			}
			else if (sc.Compare("Berserk"))
			{
				sc.MustGetString();
				FTextureID tex = TexMan.CheckForTexture(sc.String, FTexture::TEX_MiscPatch);
				if (tex.isValid()) berserkpic = TexMan[tex];
			}
			else
			{
				PClass *ti = PClass::FindClass(sc.String);
				if (!ti)
				{
					Printf("Unknown item class '%s' in ALTHUDCF\n", sc.String);
				}
				else if (!ti->IsDescendantOf(RUNTIME_CLASS(AInventory)))
				{
					Printf("Invalid item class '%s' in ALTHUDCF\n", sc.String);
					ti=NULL;
				}
				sc.MustGetString();
				FTextureID tex;

				if (!sc.Compare("0") && !sc.Compare("NULL") && !sc.Compare(""))
				{
					tex = TexMan.CheckForTexture(sc.String, FTexture::TEX_MiscPatch);
				}
				else tex.SetInvalid();

				if (ti) SetHUDIcon(static_cast<PClassInventory*>(ti), tex);
			}
		}
	}
}